

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

void SstInternalProvideTimestep
               (SstStream Stream,SstData LocalMetadata,SstData Data,ssize_t Timestep,
               FFSFormatList Formats,DataFreeFunc FreeTimestep,void *FreeClientData,
               SstData AttributeData,DataFreeFunc FreeAttributeData,void *FreeAttributelientData)

{
  size_t *psVar1;
  pthread_mutex_t *__mutex;
  undefined8 *puVar2;
  StreamStatus SVar3;
  undefined4 *puVar4;
  ReleaseRecPtr p_Var5;
  CP_DP_WSR_ReadPatternLockedFunc p_Var6;
  StepRequest __ptr;
  SstData p_Var7;
  SstPreloadModeType SVar8;
  ssize_t sVar9;
  FFSFormatList tmp;
  _TimestepMetadataMsg *RS_StreamPtr;
  CPTimestepList Entry;
  FFSFormatBlock *pFVar10;
  void **__ptr_00;
  ReturnMetadataInfo Metadata;
  FFSFormatList pFVar11;
  void *pvVar12;
  ulong uVar13;
  WS_ReaderInfo p_Var14;
  undefined4 *puVar15;
  int extraout_EDX;
  int extraout_EDX_00;
  WS_ReaderInfo extraout_RDX;
  WS_ReaderInfo extraout_RDX_00;
  WS_ReaderInfo extraout_RDX_01;
  uint uVar16;
  ulong uVar17;
  int i;
  int iVar18;
  int iVar19;
  long lVar20;
  int i_2;
  ulong uVar21;
  int i_5;
  int iVar22;
  long lVar23;
  size_t sVar24;
  RegisterQueue p_Var25;
  bool bVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  void *DP_TimestepInfo;
  void *data_block2;
  StreamStatus LocalStatus;
  int iStack_c4;
  ssize_t sStack_c0;
  ssize_t local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  _SstData *p_Stack_a0;
  _SstData *local_98;
  void *pvStack_90;
  ulong local_88;
  _ReleaseRec *p_Stack_80;
  undefined8 local_78;
  _ReleaseRec *p_Stack_70;
  ulong local_68;
  void *pvStack_60;
  void *data_block1;
  _MetadataPlusDPInfo Md;
  
  RS_StreamPtr = (_TimestepMetadataMsg *)calloc(1,0x38);
  DP_TimestepInfo = (void *)0x0;
  Entry = (CPTimestepList)calloc(1,0x70);
  __mutex = &Stream->DataLock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  Stream->WriterTimestep = Timestep;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  (*Stream->DP_Interface->provideTimestep)
            (&Svcs,Stream->DP_Stream,Data,LocalMetadata,Timestep,&DP_TimestepInfo);
  pFVar10 = Formats;
  if (Formats != (FFSFormatList)0x0) {
    for (; pFVar10 != (FFSFormatList)0x0; pFVar10 = pFVar10->Next) {
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  Md.AttributeData = AttributeData;
  Md.DP_TimestepInfo = DP_TimestepInfo;
  Md.Metadata = LocalMetadata;
  Md.Formats = Formats;
  if (_perfstubs_initialized == 1 && Data != (SstData)0x0) {
    if (SstInternalProvideTimestep::__var2102 == (void *)0x0) {
      SstInternalProvideTimestep::__var2102 = (void *)ps_create_counter_("Timestep local data size")
      ;
    }
    ps_sample_counter_(SUB84(((double)CONCAT44(0x45300000,(int)(Data->DataSize >> 0x20)) -
                             1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)Data->DataSize) - 4503599627370496.0)
                             ,0),SstInternalProvideTimestep::__var2102);
  }
  if ((LocalMetadata != (SstData)0x0) && (_perfstubs_initialized == 1)) {
    if (SstInternalProvideTimestep::__var2106 == (void *)0x0) {
      SstInternalProvideTimestep::__var2106 =
           (void *)ps_create_counter_("Timestep local metadata size");
    }
    ps_sample_counter_(SUB84(((double)CONCAT44(0x45300000,(int)(LocalMetadata->DataSize >> 0x20)) -
                             1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)LocalMetadata->DataSize) -
                             4503599627370496.0),0),SstInternalProvideTimestep::__var2106);
  }
  Stream->LastProvidedTimestep = Timestep;
  if ((Timestep == 0) && (Stream->ConfigParams->FirstTimestepPrecious != 0)) {
    Entry->PreciousTimestep = 1;
  }
  Entry->ReferenceCount = 1;
  Entry->DPRegistered = 1;
  Entry->Timestep = Timestep;
  Entry->Msg = RS_StreamPtr;
  Entry->MetadataArray = RS_StreamPtr->Metadata;
  Entry->DP_TimestepInfo = RS_StreamPtr->DP_TimestepInfo;
  Entry->FreeTimestep = FreeTimestep;
  Entry->FreeClientData = FreeClientData;
  Entry->Next = Stream->QueuedTimesteps;
  Entry->InProgressFlag = 1;
  Stream->QueuedTimesteps = Entry;
  Stream->QueuedTimestepCount = Stream->QueuedTimestepCount + 1;
  psVar1 = &(Stream->Stats).TimestepsCreated;
  *psVar1 = *psVar1 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (_perfstubs_initialized == 1) {
    if (SstInternalProvideTimestep::timerMD == (void *)0x0) {
      SstInternalProvideTimestep::timerMD =
           (void *)ps_timer_create_("Metadata Consolidation time in EndStep()");
    }
    ps_timer_start_(SstInternalProvideTimestep::timerMD);
  }
  __ptr_00 = CP_consolidateDataToRankZero
                       (Stream,&Md,Stream->CPInfo->PerRankMetadataFormat,&data_block1);
  if (Stream->Rank == 0) {
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    p_Var25 = Stream->ReaderRegisterQueue;
    QueueMaintenance(Stream);
    if (Stream->QueueFullPolicy == SstQueueFullDiscard) {
      CP_verbose(Stream,TraceVerbose,
                 "Testing Discard Condition, Queued Timestep Count %d, QueueLimit %d\n");
      QueueMaintenance(Stream);
      uVar16 = (uint)(Stream->QueueLimit < Stream->QueuedTimestepCount);
    }
    else {
      uVar16 = 0;
      while ((0 < Stream->QueueLimit && (Stream->QueueLimit < Stream->QueuedTimestepCount))) {
        CP_verbose(Stream,PerStepVerbose,"Blocking on QueueFull condition\n");
        pthread_cond_wait((pthread_cond_t *)&Stream->DataCondition,(pthread_mutex_t *)__mutex);
      }
    }
    pvStack_60 = (void *)0x0;
    local_78 = 0;
    local_98 = (_SstData *)0x0;
    pvStack_90 = (void *)0x0;
    local_a8 = 0;
    p_Stack_a0 = (_SstData *)0x0;
    local_b8 = 0;
    uStack_b0 = 0;
    sStack_c0 = 0;
    iVar22 = 1;
    iVar19 = 0;
    for (; iVar18 = iVar22, p_Var25 != (RegisterQueue)0x0; p_Var25 = p_Var25->Next) {
      iVar22 = iVar18 + 1;
      iVar19 = iVar18;
    }
    _LocalStatus = CONCAT44(iVar19,uVar16);
    local_88 = (ulong)(uint)Stream->ReleaseCount;
    p_Stack_80 = Stream->ReleaseList;
    local_68 = (ulong)(uint)Stream->LockDefnsCount;
    p_Stack_70 = Stream->LockDefnsList;
    uVar16 = Stream->ReaderCount;
    pvStack_60 = malloc((long)(int)uVar16 << 2);
    local_78 = CONCAT44(local_78._4_4_,uVar16);
    uVar21 = 0;
    uVar17 = 0;
    if (0 < (int)uVar16) {
      uVar17 = (ulong)uVar16;
    }
    for (; uVar17 != uVar21; uVar21 = uVar21 + 1) {
      *(StreamStatus *)((long)pvStack_60 + uVar21 * 4) = Stream->Readers[uVar21]->ReaderStatus;
    }
    Stream->ReleaseCount = 0;
    Stream->ReleaseList = (_ReleaseRec *)0x0;
    Stream->LockDefnsCount = 0;
    Stream->LockDefnsList = (_ReleaseRec *)0x0;
    uVar21 = (ulong)Stream->CohortSize;
    uStack_b0 = CONCAT44(uStack_b0._4_4_,Stream->CohortSize);
    local_b8 = Stream->WriterTimestep;
    p_Stack_a0 = (_SstData *)malloc(uVar21 << 4);
    local_98 = (_SstData *)malloc(uVar21 << 4);
    pvStack_90 = malloc(uVar21 << 3);
    lVar23 = 0;
    pFVar11 = (FFSFormatList)0x0;
    iVar19 = 0;
    for (lVar20 = 0; lVar20 < (int)uVar21; lVar20 = lVar20 + 1) {
      puVar4 = (undefined4 *)**(long **)((long)__ptr_00 + lVar23);
      puVar15 = (undefined4 *)((long)&p_Stack_a0->DataSize + lVar23 * 2);
      if (puVar4 == (undefined4 *)0x0) {
        uVar27 = 0;
        uVar28 = 0;
        uVar29 = 0;
        uVar30 = 0;
      }
      else {
        uVar27 = *puVar4;
        uVar28 = puVar4[1];
        uVar29 = puVar4[2];
        uVar30 = puVar4[3];
      }
      *puVar15 = uVar27;
      puVar15[1] = uVar28;
      puVar15[2] = uVar29;
      puVar15[3] = uVar30;
      puVar4 = *(undefined4 **)(*(long *)((long)__ptr_00 + lVar23) + 8);
      puVar15 = (undefined4 *)((long)&local_98->DataSize + lVar23 * 2);
      if (puVar4 == (undefined4 *)0x0) {
        uVar27 = 0;
        uVar28 = 0;
        uVar29 = 0;
        uVar30 = 0;
      }
      else {
        uVar27 = *puVar4;
        uVar28 = puVar4[1];
        uVar29 = puVar4[2];
        uVar30 = puVar4[3];
      }
      *puVar15 = uVar27;
      puVar15[1] = uVar28;
      puVar15[2] = uVar29;
      puVar15[3] = uVar30;
      *(undefined8 *)((long)pvStack_90 + lVar23) =
           *(undefined8 *)(*(long *)((long)__ptr_00 + lVar23) + 0x18);
      iVar19 = iVar19 + (uint)(*(long *)(*(long *)((long)__ptr_00 + lVar23) + 0x18) == 0);
      pFVar11 = AddUniqueFormats(pFVar11,*(FFSFormatList *)
                                          (*(long *)((long)__ptr_00 + lVar23) + 0x10),0);
      uVar21 = (ulong)(uint)Stream->CohortSize;
      lVar23 = lVar23 + 8;
    }
    if (iVar19 == (int)uVar21) {
      free(pvStack_90);
      pvStack_90 = (void *)0x0;
    }
    if (Stream->AssembleMetadataUpcall == (AssembleMetadataUpcallFunc)0x0) {
      pvVar12 = (void *)0x0;
    }
    else {
      pvVar12 = (*Stream->AssembleMetadataUpcall)
                          (Stream->UpcallWriter,Stream->CohortSize,p_Stack_a0,local_98);
      iVar19 = Stream->CohortSize;
      lVar20 = 0x10;
      for (lVar23 = 1; lVar23 < iVar19; lVar23 = lVar23 + 1) {
        puVar2 = (undefined8 *)((long)&p_Stack_a0->DataSize + lVar20);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)&local_98->DataSize + lVar20);
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar20 = lVar20 + 0x10;
      }
    }
    free(__ptr_00);
    pFVar11 = AddUniqueFormats(Stream->PreviousFormats,pFVar11,1);
    Stream->PreviousFormats = pFVar11;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    Metadata = (ReturnMetadataInfo)
               CP_distributeDataFromRankZero
                         (Stream,&LocalStatus,Stream->CPInfo->ReturnMetadataInfoFormat,&data_block2)
    ;
    if (Stream->FreeMetadataUpcall != (FreeMetadataUpcallFunc)0x0) {
      (*Stream->FreeMetadataUpcall)
                (Stream->UpcallWriter,RS_StreamPtr->Metadata,RS_StreamPtr->AttributeData,pvVar12);
    }
    free(pvStack_60);
    free(p_Stack_80);
    free(p_Stack_70);
    free(p_Stack_a0);
    free(local_98);
  }
  else {
    Metadata = (ReturnMetadataInfo)
               CP_distributeDataFromRankZero
                         (Stream,(void *)0x0,Stream->CPInfo->ReturnMetadataInfoFormat,&data_block2);
    pFVar11 = AddUniqueFormats(Stream->PreviousFormats,(Metadata->Msg).Formats,1);
    Stream->PreviousFormats = pFVar11;
  }
  free(data_block1);
  iVar19 = Metadata->PendingReaderCount;
  RS_StreamPtr->DP_TimestepInfo = (Metadata->Msg).DP_TimestepInfo;
  p_Var7 = (Metadata->Msg).AttributeData;
  RS_StreamPtr->Metadata = (Metadata->Msg).Metadata;
  RS_StreamPtr->AttributeData = p_Var7;
  SVar8 = (Metadata->Msg).PreloadMode;
  pFVar11 = (Metadata->Msg).Formats;
  RS_StreamPtr->CohortSize = (Metadata->Msg).CohortSize;
  RS_StreamPtr->PreloadMode = SVar8;
  RS_StreamPtr->Formats = pFVar11;
  uVar27 = *(undefined4 *)((long)&(Metadata->Msg).RS_Stream + 4);
  sVar9 = (Metadata->Msg).Timestep;
  uVar28 = *(undefined4 *)((long)&(Metadata->Msg).Timestep + 4);
  *(undefined4 *)&RS_StreamPtr->RS_Stream = *(undefined4 *)&(Metadata->Msg).RS_Stream;
  *(undefined4 *)((long)&RS_StreamPtr->RS_Stream + 4) = uVar27;
  *(int *)&RS_StreamPtr->Timestep = (int)sVar9;
  *(undefined4 *)((long)&RS_StreamPtr->Timestep + 4) = uVar28;
  RS_StreamPtr->CohortSize = Stream->CohortSize;
  RS_StreamPtr->Timestep = Timestep;
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(SstInternalProvideTimestep::timerMD);
  }
  Entry->Msg = RS_StreamPtr;
  Entry->MetadataArray = RS_StreamPtr->Metadata;
  Entry->DP_TimestepInfo = RS_StreamPtr->DP_TimestepInfo;
  Entry->DataBlockToFree = data_block2;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  for (uVar21 = 0; (long)uVar21 < (long)Metadata->ReaderCount; uVar21 = uVar21 + 1) {
    SVar3 = Stream->Readers[uVar21]->ReaderStatus;
    if (SVar3 != Metadata->ReaderStatus[uVar21]) {
      CP_verbose(Stream,PerRankVerbose,"Adjusting reader %d status from %s to %s\n",
                 uVar21 & 0xffffffff,SSTStreamStatusStr[SVar3],
                 SSTStreamStatusStr[Metadata->ReaderStatus[uVar21]]);
      CP_PeerFailCloseWSReader(Stream->Readers[uVar21],Metadata->ReaderStatus[uVar21]);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  for (lVar20 = 0; lVar20 < Metadata->LockDefnsCount; lVar20 = lVar20 + 1) {
    uVar21 = (ulong)(uint)Stream->ReaderCount;
    if (Stream->ReaderCount < 1) {
      uVar21 = 0;
    }
    p_Var5 = Metadata->LockDefnsList;
    uVar17 = 0;
    while ((uVar13 = uVar21, uVar21 != uVar17 &&
           (uVar13 = uVar17, Stream->Readers[uVar17]->RankZeroID != p_Var5[lVar20].Reader))) {
      uVar17 = uVar17 + 1;
    }
    Stream->Readers[uVar13]->FullCommPatternLocked = 1;
    CP_verbose(Stream,TraceVerbose,"LockDefns List, FOUND TS %zd\n",p_Var5[lVar20].Timestep);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if ((Stream->ConfigParams->CPCommPattern == 0) && (Stream->Rank != 0)) {
    ProcessReleaseList(Stream,Metadata);
  }
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  iVar22 = 0;
  for (uVar21 = 0; (long)uVar21 < (long)Stream->ReaderCount; uVar21 = uVar21 + 1) {
    p_Var14 = Stream->Readers[uVar21];
    if ((p_Var14->FullCommPatternLocked != 0) && (p_Var14->CommPatternLockTimestep == -1)) {
      _LocalStatus = 0;
      sStack_c0 = 0;
      p_Var14 = Stream->Readers[uVar21];
      p_Var14->CommPatternLockTimestep = Timestep;
      p_Var6 = Stream->DP_Interface->WSRreadPatternLocked;
      if (p_Var6 != (CP_DP_WSR_ReadPatternLockedFunc)0x0) {
        (*p_Var6)(&Svcs,p_Var14->DP_WSR_Stream,Timestep);
        p_Var14 = Stream->Readers[uVar21];
      }
      iVar22 = iVar22 + 1;
      sStack_c0 = Timestep;
      sendOneToWSRCohort(p_Var14,Stream->CPInfo->SharedCM->CommPatternLockedFormat,&LocalStatus,
                         (void **)&LocalStatus);
      p_Var14 = Stream->Readers[uVar21];
      p_Var14->PreloadMode = SstPreloadLearned;
      p_Var14->PreloadModeActiveTimestep = Timestep;
      CP_verbose(Stream,PerStepVerbose,
                 "Setting preload mode Learned for reader %d, active at timestep %zd\n",
                 uVar21 & 0xffffffff,Timestep);
    }
  }
  if (iVar22 != 0) {
    CP_verbose(Stream,TraceVerbose,"Doing a barrier after notifying DP of preload mode changes\n");
    SMPI_Barrier(Stream->mpiComm);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (_perfstubs_initialized == 1) {
    if (SstInternalProvideTimestep::timerTS == (void *)0x0) {
      SstInternalProvideTimestep::timerTS = (void *)ps_timer_create_("provide timestep operations");
    }
    ps_timer_start_(SstInternalProvideTimestep::timerTS);
  }
  if (Metadata->DiscardThisTimestep != 0) {
    RS_StreamPtr->Metadata = (SstData)0x0;
    RS_StreamPtr->DP_TimestepInfo = (void **)0x0;
    CP_verbose(Stream,PerStepVerbose,
               "Sending Empty TimestepMetadata for Discarded timestep %ld, one to each reader\n",
               Timestep);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    sendOneToEachReaderRank
              (Stream,Stream->CPInfo->SharedCM->DeliverTimestepMetadataFormat,RS_StreamPtr,
               (void **)RS_StreamPtr);
    Entry->Expired = 1;
    Entry->ReferenceCount = 0;
    goto LAB_006bfa6d;
  }
  CP_verbose(Stream,PerStepVerbose,
             "Sending TimestepMetadata for timestep %ld (ref count %d), one to each reader\n",
             Timestep,(ulong)(uint)Entry->ReferenceCount);
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  iVar22 = (int)extraout_RDX;
  sVar24 = Stream->ConfigParams->StepDistributionMode;
  p_Var14 = extraout_RDX;
  if (sVar24 == 2) {
LAB_006bf9ee:
    iVar22 = (int)p_Var14;
    if (Stream->ReaderCount != 0) {
      do {
        iVar22 = (int)p_Var14;
        __ptr = Stream->StepRequestQueue;
        if (__ptr == (StepRequest)0x0) goto LAB_006bfa5d;
        Stream->StepRequestQueue = __ptr->Next;
        iVar22 = __ptr->RequestingReader;
        free(__ptr);
        p_Var14 = Stream->Readers[iVar22];
      } while (p_Var14->ReaderStatus != Established);
      Stream->LastDemandTimestep = Entry->Timestep;
      SendTimestepEntryToSingleReader(Stream,Entry,p_Var14,iVar22);
      iVar22 = extraout_EDX;
      if ((Stream->CloseTimestepCount != 0xffffffffffffffff) &&
         (Stream->LastDemandTimestep == Stream->CloseTimestepCount)) {
        SendCloseMsgs(Stream);
        iVar22 = extraout_EDX_00;
      }
    }
  }
  else if (sVar24 == 1) {
    if ((long)Stream->ReaderCount != 0) {
      uVar21 = Stream->NextRRDistribution;
      if ((ulong)(long)Stream->ReaderCount <= uVar21) {
        Stream->NextRRDistribution = 0;
        uVar21 = 0;
      }
      CP_verbose(Stream,PerRankVerbose,"Round Robin Distribution, step sent to reader %ld\n",uVar21)
      ;
      SendTimestepEntryToSingleReader
                (Stream,Entry,Stream->Readers[Stream->NextRRDistribution],
                 (int)Stream->NextRRDistribution);
      Stream->NextRRDistribution = Stream->NextRRDistribution + 1;
      p_Var14 = extraout_RDX_01;
      goto LAB_006bf9ee;
    }
  }
  else if (sVar24 == 0) {
    for (; iVar22 = (int)p_Var14, (long)sVar24 < (long)Stream->ReaderCount; sVar24 = sVar24 + 1) {
      SendTimestepEntryToSingleReader(Stream,Entry,Stream->Readers[sVar24],(int)sVar24);
      p_Var14 = extraout_RDX_00;
    }
  }
LAB_006bfa5d:
  Entry->InProgressFlag = 0;
  SubRefTimestep(Stream,Entry->Timestep,iVar22);
LAB_006bfa6d:
  QueueMaintenance(Stream);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  do {
    bVar26 = iVar19 == 0;
    iVar19 = iVar19 + -1;
    if (bVar26) {
LAB_006bfb65:
      if (_perfstubs_initialized == 1) {
        ps_timer_stop_(SstInternalProvideTimestep::timerTS);
      }
      return;
    }
    if (Stream->Rank == 0) {
      CP_verbose(Stream,SummaryVerbose,"Writer side ReaderLateArrival accepting incoming reader\n");
    }
    p_Var14 = WriterParticipateInReaderOpen(Stream);
    if (p_Var14 == (WS_ReaderInfo)0x0) {
      CP_error(Stream,"Potential reader registration failed\n");
      goto LAB_006bfb65;
    }
    if (Stream->ConfigParams->CPCommPattern == 1) {
      waitForReaderResponseAndSendQueued(p_Var14);
    }
    else if (Stream->Rank == 0) {
      waitForReaderResponseAndSendQueued(p_Var14);
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      _LocalStatus = CONCAT44(iStack_c4,p_Var14->ReaderStatus);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      SMPI_Bcast(&LocalStatus,1,SMPI_INT,0,Stream->mpiComm);
    }
    else {
      SMPI_Bcast(&LocalStatus,1,SMPI_INT,0,Stream->mpiComm);
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      p_Var14->ReaderStatus = LocalStatus;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
  } while( true );
}

Assistant:

extern void SstInternalProvideTimestep(SstStream Stream, SstData LocalMetadata, SstData Data,
                                       ssize_t Timestep, FFSFormatList Formats,
                                       DataFreeFunc FreeTimestep, void *FreeClientData,
                                       SstData AttributeData, DataFreeFunc FreeAttributeData,
                                       void *FreeAttributelientData)
{
    void *data_block1, *data_block2;
    MetadataPlusDPInfo *pointers;
    ReturnMetadataInfo ReturnData;
    struct _TimestepMetadataMsg *Msg = malloc(sizeof(*Msg));
    void *DP_TimestepInfo = NULL;
    struct _MetadataPlusDPInfo Md;
    CPTimestepList Entry = calloc(1, sizeof(struct _CPTimestepEntry));
    int PendingReaderCount = 0;

    memset(Msg, 0, sizeof(*Msg));
    STREAM_MUTEX_LOCK(Stream);
    Stream->WriterTimestep = Timestep;

    STREAM_MUTEX_UNLOCK(Stream);
    Stream->DP_Interface->provideTimestep(&Svcs, Stream->DP_Stream, Data, LocalMetadata, Timestep,
                                          &DP_TimestepInfo);
    if (Formats)
    {
        FFSFormatList tmp = Formats;
        while (tmp)
        {
            tmp = tmp->Next;
        }
    }
    STREAM_MUTEX_LOCK(Stream);

    /* Md is the local contribution to MetaData */
    Md.Formats = Formats;
    Md.Metadata = (SstData)LocalMetadata;
    Md.AttributeData = (SstData)AttributeData;
    Md.DP_TimestepInfo = DP_TimestepInfo;

    if (Data)
    {
        PERFSTUBS_SAMPLE_COUNTER("Timestep local data size", Data->DataSize);
    }
    if (LocalMetadata)
    {
        PERFSTUBS_SAMPLE_COUNTER("Timestep local metadata size", LocalMetadata->DataSize);
    }

    /* preliminary queue of message before metadata collection.  Timestep may
     * still be discarded.*/

    Stream->LastProvidedTimestep = Timestep;
    if (Stream->ConfigParams->FirstTimestepPrecious && (Timestep == 0))
    {
        Entry->PreciousTimestep = 1;
    }
    Entry->ReferenceCount = 1; /* holding one for us, so it doesn't disappear under us */
    Entry->DPRegistered = 1;
    Entry->Timestep = Timestep;
    Entry->Msg = Msg;
    Entry->MetadataArray = Msg->Metadata;
    Entry->DP_TimestepInfo = Msg->DP_TimestepInfo;
    Entry->FreeTimestep = FreeTimestep;
    Entry->FreeClientData = FreeClientData;
    Entry->Next = Stream->QueuedTimesteps;
    Entry->InProgressFlag = 1;

    Stream->QueuedTimesteps = Entry;
    Stream->QueuedTimestepCount++;
    Stream->Stats.TimestepsCreated++;
    /* no one waits on timesteps being added, so no condition signal to note
     * change */

    STREAM_MUTEX_UNLOCK(Stream);

    PERFSTUBS_TIMER_START(timerMD, "Metadata Consolidation time in EndStep()");
    pointers = (MetadataPlusDPInfo *)CP_consolidateDataToRankZero(
        Stream, &Md, Stream->CPInfo->PerRankMetadataFormat, &data_block1);

    if (Stream->Rank == 0)
    {
        int DiscardThisTimestep = 0;
        struct _ReturnMetadataInfo TimestepMetaData;
        RegisterQueue ArrivingReader;
        void *MetadataFreeValue;
        STREAM_MUTEX_LOCK(Stream);
        ArrivingReader = Stream->ReaderRegisterQueue;
        QueueMaintenance(Stream);
        if (Stream->QueueFullPolicy == SstQueueFullDiscard)
        {
            CP_verbose(Stream, TraceVerbose,
                       "Testing Discard Condition, Queued Timestep Count %d, "
                       "QueueLimit %d\n",
                       Stream->QueuedTimestepCount, Stream->QueueLimit);
            QueueMaintenance(Stream);
            if (Stream->QueuedTimestepCount > Stream->QueueLimit)
            {
                DiscardThisTimestep = 1;
            }
        }
        else
        {
            while ((Stream->QueueLimit > 0) && (Stream->QueuedTimestepCount > Stream->QueueLimit))
            {
                CP_verbose(Stream, PerStepVerbose, "Blocking on QueueFull condition\n");
                STREAM_CONDITION_WAIT(Stream);
            }
        }
        memset(&TimestepMetaData, 0, sizeof(TimestepMetaData));
        TimestepMetaData.PendingReaderCount = 0;
        while (ArrivingReader)
        {
            TimestepMetaData.PendingReaderCount++;
            ArrivingReader = ArrivingReader->Next;
        }

        TimestepMetaData.DiscardThisTimestep = DiscardThisTimestep;
        TimestepMetaData.ReleaseCount = Stream->ReleaseCount;
        TimestepMetaData.ReleaseList = Stream->ReleaseList;
        TimestepMetaData.LockDefnsCount = Stream->LockDefnsCount;
        TimestepMetaData.LockDefnsList = Stream->LockDefnsList;
        TimestepMetaData.ReaderStatus = malloc(sizeof(enum StreamStatus) * Stream->ReaderCount);
        TimestepMetaData.ReaderCount = Stream->ReaderCount;
        for (int i = 0; i < Stream->ReaderCount; i++)
        {
            TimestepMetaData.ReaderStatus[i] = Stream->Readers[i]->ReaderStatus;
        }
        Stream->ReleaseCount = 0;
        Stream->ReleaseList = NULL;
        Stream->LockDefnsCount = 0;
        Stream->LockDefnsList = NULL;
        MetadataFreeValue = FillMetadataMsg(Stream, &TimestepMetaData.Msg, pointers);
        STREAM_MUTEX_UNLOCK(Stream);
        ReturnData = CP_distributeDataFromRankZero(
            Stream, &TimestepMetaData, Stream->CPInfo->ReturnMetadataInfoFormat, &data_block2);
        if (Stream->FreeMetadataUpcall)
        {
            Stream->FreeMetadataUpcall(Stream->UpcallWriter, Msg->Metadata, Msg->AttributeData,
                                       MetadataFreeValue);
        }
        free(TimestepMetaData.ReaderStatus);
        if (TimestepMetaData.ReleaseList)
            free(TimestepMetaData.ReleaseList);
        if (TimestepMetaData.LockDefnsList)
            free(TimestepMetaData.LockDefnsList);
        free(TimestepMetaData.Msg.Metadata);
        free(TimestepMetaData.Msg.AttributeData);
    }
    else
    {
        /* other ranks */
        ReturnData = CP_distributeDataFromRankZero(
            Stream, NULL, Stream->CPInfo->ReturnMetadataInfoFormat, &data_block2);
        Stream->PreviousFormats =
            AddUniqueFormats(Stream->PreviousFormats, ReturnData->Msg.Formats, /*copy*/ 1);
    }
    free(data_block1);
    PendingReaderCount = ReturnData->PendingReaderCount;
    *Msg = ReturnData->Msg;
    Msg->CohortSize = Stream->CohortSize;
    Msg->Timestep = Timestep;
    PERFSTUBS_TIMER_STOP(timerMD);

    /*
     * lock this Stream's data and queue the timestep
     */
    Entry->Msg = Msg;
    Entry->MetadataArray = Msg->Metadata;
    Entry->DP_TimestepInfo = Msg->DP_TimestepInfo;
    Entry->DataBlockToFree = data_block2;

    ProcessReaderStatusList(Stream, ReturnData);

    ProcessLockDefnsList(Stream, ReturnData);

    if ((Stream->ConfigParams->CPCommPattern == SstCPCommMin) && (Stream->Rank != 0))
    {
        ProcessReleaseList(Stream, ReturnData);
    }
    ActOnTSLockStatus(Stream, Timestep);
    PERFSTUBS_TIMER_START(timerTS, "provide timestep operations");
    if (ReturnData->DiscardThisTimestep)
    {
        /* Data was actually discarded, but we want to send a message to each
         * reader so that it knows a step was discarded, but actually so that we
         * get an error return if the write fails */

        Msg->Metadata = NULL;
        Msg->DP_TimestepInfo = NULL;

        CP_verbose(Stream, PerStepVerbose,
                   "Sending Empty TimestepMetadata for Discarded "
                   "timestep %ld, one to each reader\n",
                   Timestep);

        STREAM_MUTEX_LOCK(Stream);
        sendOneToEachReaderRank(Stream, Stream->CPInfo->SharedCM->DeliverTimestepMetadataFormat,
                                Msg, &Msg->RS_Stream);

        Entry->Expired = 1;
        Entry->ReferenceCount = 0;
        QueueMaintenance(Stream);
        STREAM_MUTEX_UNLOCK(Stream);
    }
    else
    {

        CP_verbose(Stream, PerStepVerbose,
                   "Sending TimestepMetadata for timestep %ld (ref count "
                   "%d), one to each reader\n",
                   Timestep, Entry->ReferenceCount);

        STREAM_MUTEX_LOCK(Stream);
        SendTimestepEntryToReaders(Stream, Entry);
        Entry->InProgressFlag = 0;
        SubRefTimestep(Stream, Entry->Timestep, 0);
        QueueMaintenance(Stream);
        STREAM_MUTEX_UNLOCK(Stream);
    }
    while (PendingReaderCount--)
    {
        WS_ReaderInfo reader;
        if (Stream->Rank == 0)
        {
            CP_verbose(Stream, SummaryVerbose,
                       "Writer side ReaderLateArrival accepting incoming reader\n");
        }
        reader = WriterParticipateInReaderOpen(Stream);
        if (!reader)
        {
            CP_error(Stream, "Potential reader registration failed\n");
            break;
        }
        if (Stream->ConfigParams->CPCommPattern == SstCPCommPeer)
        {
            waitForReaderResponseAndSendQueued(reader);
        }
        else
        {
            enum StreamStatus LocalStatus;
            if (Stream->Rank == 0)
            {
                waitForReaderResponseAndSendQueued(reader);
                STREAM_MUTEX_LOCK(Stream);
                LocalStatus = reader->ReaderStatus;
                STREAM_MUTEX_UNLOCK(Stream);
                SMPI_Bcast(&LocalStatus, 1, SMPI_INT, 0, Stream->mpiComm);
            }
            else
            {
                SMPI_Bcast(&LocalStatus, 1, SMPI_INT, 0, Stream->mpiComm);
                STREAM_MUTEX_LOCK(Stream);
                reader->ReaderStatus = LocalStatus;
                STREAM_MUTEX_UNLOCK(Stream);
            }
        }
    }
    PERFSTUBS_TIMER_STOP(timerTS);
}